

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

bool __thiscall google::protobuf::MapKey::operator<(MapKey *this,MapKey *other)

{
  CppType CVar1;
  byte extraout_var;
  LogMessage *pLVar2;
  bool bVar3;
  bool bVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->type_ != other->type_) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.h"
               ,0x1c1);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"Unsupported: type mismatch");
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  CVar1 = type(this);
  switch(CVar1) {
  case CPPTYPE_INT32:
    bVar4 = SBORROW4((this->val_).int32_value_,(other->val_).int32_value_);
    bVar3 = (this->val_).int32_value_ - (other->val_).int32_value_ < 0;
    goto LAB_00369eb4;
  case CPPTYPE_INT64:
    bVar4 = SBORROW8((this->val_).int64_value_,(other->val_).int64_value_);
    bVar3 = (this->val_).int64_value_ - (other->val_).int64_value_ < 0;
LAB_00369eb4:
    bVar3 = bVar4 != bVar3;
    break;
  case CPPTYPE_UINT32:
    bVar3 = (this->val_).uint32_value_ < (other->val_).uint32_value_;
    break;
  case CPPTYPE_UINT64:
    bVar3 = (this->val_).string_value_ < (other->val_).string_value_;
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.h"
               ,0x1c8);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"Unsupported");
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  default:
    bVar3 = false;
    break;
  case CPPTYPE_BOOL:
    bVar3 = (this->val_).bool_value_ < (other->val_).bool_value_;
    break;
  case CPPTYPE_STRING:
    std::__cxx11::string::compare((string *)(this->val_).string_value_);
    bVar3 = (bool)(extraout_var >> 7);
  }
  return bVar3;
}

Assistant:

bool operator<(const MapKey& other) const {
    if (type_ != other.type_) {
      // We could define a total order that handles this case, but
      // there currently no need.  So, for now, fail.
      GOOGLE_LOG(FATAL) << "Unsupported: type mismatch";
    }
    switch (type()) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        return false;
      case FieldDescriptor::CPPTYPE_STRING:
        return *val_.string_value_ < *other.val_.string_value_;
      case FieldDescriptor::CPPTYPE_INT64:
        return val_.int64_value_ < other.val_.int64_value_;
      case FieldDescriptor::CPPTYPE_INT32:
        return val_.int32_value_ < other.val_.int32_value_;
      case FieldDescriptor::CPPTYPE_UINT64:
        return val_.uint64_value_ < other.val_.uint64_value_;
      case FieldDescriptor::CPPTYPE_UINT32:
        return val_.uint32_value_ < other.val_.uint32_value_;
      case FieldDescriptor::CPPTYPE_BOOL:
        return val_.bool_value_ < other.val_.bool_value_;
    }
    return false;
  }